

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>::__decodeArray
          (SimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t *length,uint32_t *out,
          size_t nvalue)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  ulong uVar6;
  uint uVar7;
  pointer puVar8;
  long lVar9;
  uint32_t *puVar10;
  size_t cap;
  size_t local_38;
  
  uVar6 = (ulong)*in;
  puVar5 = (uint32_t *)((long)in + ((ulong)in[uVar6] + 3 & 0xfffffffffffffffc) + 4 + uVar6 * 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->datatobepacked,
             (long)(this->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)(this->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  puVar10 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_38 = (long)(this->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar10 >> 2;
  puVar5 = Simple8b<true>::decodeArray
                     (&this->ecoder,puVar5,(long)((long)in + (*length * 4 - (long)puVar5)) >> 2,
                      puVar10,&local_38);
  *length = (long)puVar5 - (long)in >> 2;
  if (0x7f < nvalue) {
    puVar5 = in + uVar6 + 1;
    puVar10 = in + 1;
    puVar8 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      bVar1 = (byte)*puVar5;
      bVar2 = *(byte *)((long)puVar5 + 1);
      uVar7 = (uint)bVar2;
      lVar9 = 0;
      do {
        fastunpack(puVar10,(uint32_t *)((long)out + lVar9),(uint)bVar1);
        puVar10 = (uint32_t *)((long)puVar10 + (ulong)((uint)bVar1 * 4));
        lVar9 = lVar9 + 0x80;
      } while (lVar9 != 0x200);
      puVar5 = (uint32_t *)((long)puVar5 + 2);
      if (bVar2 != 0) {
        do {
          uVar4 = *puVar5;
          uVar3 = *puVar8;
          puVar5 = (uint32_t *)((long)puVar5 + 1);
          puVar8 = puVar8 + 1;
          out[(byte)uVar4] = out[(byte)uVar4] | uVar3 << (bVar1 & 0x1f);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      out = out + 0x80;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < nvalue >> 7);
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, uint32_t *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    datatobepacked.resize(datatobepacked.capacity());
    size_t cap = datatobepacked.size();
    size_t le = initin + length - inexcept;
    inexcept = ecoder.decodeArray(inexcept, le, &datatobepacked[0], cap);

    length = inexcept - initin;

    auto exceptionsptr = datatobepacked.begin();
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblock<BlockSize>(in, out, b);
      for (uint32_t k = 0; k < cexcept; ++k) {
        const uint8_t pos = *(bytep++);
        out[pos] |= (*(exceptionsptr++)) << b;
      }
    }
    assert(in == headerin + wheremeta);
  }